

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolorspace.cpp
# Opt level: O3

QDataStream * operator>>(QDataStream *s,QColorSpace *colorSpace)

{
  QExplicitlySharedDataPointer<QColorSpacePrivate> QVar1;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointer<QColorSpacePrivate> local_60;
  QByteArray local_58;
  QExplicitlySharedDataPointer<QColorSpacePrivate> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = 0;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char *)0x0;
  operator>>(s,&local_58);
  QColorSpace::fromIccProfile((QColorSpace *)&local_60,&local_58);
  QVar1.d.ptr = local_60.d.ptr;
  local_60.d.ptr = (totally_ordered_wrapper<QColorSpacePrivate_*>)(QColorSpacePrivate *)0x0;
  local_38.d.ptr = (totally_ordered_wrapper<QColorSpacePrivate_*>)(colorSpace->d_ptr).d.ptr;
  (colorSpace->d_ptr).d.ptr = (QColorSpacePrivate *)QVar1.d.ptr;
  QColorSpace::~QColorSpace((QColorSpace *)&local_38);
  QColorSpace::~QColorSpace((QColorSpace *)&local_60);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &s, QColorSpace &colorSpace)
{
    QByteArray iccProfile;
    s >> iccProfile;
    colorSpace = QColorSpace::fromIccProfile(iccProfile);
    return s;
}